

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  long lVar1;
  DataReader *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  ulong __new_size;
  size_t __n;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  void *refbuf;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  Mat local_4a8;
  uint local_45c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  unsigned_short *local_440;
  Mat local_438 [14];
  
  local_4a8.cstep = 0;
  local_4a8.data = (unsigned_short *)0x0;
  local_4a8.refcount._0_4_ = 0;
  local_4a8.refcount._4_4_ = 0;
  local_4a8.elemsize._0_4_ = 0;
  local_4a8.elemsize._4_4_ = 0;
  local_4a8.elempack = 0;
  local_4a8.allocator = (Allocator *)0x0;
  local_4a8.dims = 0;
  local_4a8.w = 0;
  local_4a8.h = 0;
  local_4a8.d = 0;
  local_4a8.c = 0;
  if (type == 1) {
    local_438[0].data = (unsigned_short *)0x0;
    pDVar2 = this->d->dr;
    lVar1 = (long)w * 4;
    iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
    puVar7 = (unsigned_short *)local_438[0].data;
    if (CONCAT44(extraout_var_01,iVar3) == lVar1) {
      piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_4a8.allocator == (Allocator *)0x0) {
LAB_0016328b:
            puVar7 = (unsigned_short *)local_438[0].data;
            if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
              free(local_4a8.data);
            }
          }
          else {
            (*(local_4a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_00163298:
      local_4a8.cstep = (size_t)w;
      local_4a8.refcount._0_4_ = 0;
      local_4a8.refcount._4_4_ = 0;
      local_4a8.elemsize._0_4_ = 4;
      local_4a8.elemsize._4_4_ = 0;
      local_4a8.elempack = 1;
      local_4a8.allocator = (Allocator *)0x0;
      local_4a8.dims = 1;
      local_4a8.h = 1;
      local_4a8.d = 1;
      local_4a8.c = 1;
      local_4a8.data = puVar7;
      local_4a8.w = w;
      goto LAB_001632f8;
    }
    Mat::create(&local_4a8,w,4,(Allocator *)0x0);
    if (((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) &&
       ((long)local_4a8.c * local_4a8.cstep != 0)) {
      pDVar2 = this->d->dr;
      iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4a8.data,lVar1);
      if (CONCAT44(extraout_var_02,iVar3) != lVar1) {
        load();
        goto LAB_001636c7;
      }
      goto LAB_001632f8;
    }
LAB_00163418:
    __return_storage_ptr__->data = local_4a8.data;
LAB_00163684:
    piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
    __return_storage_ptr__->refcount = piVar4;
    __return_storage_ptr__->elemsize =
         CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
    __return_storage_ptr__->elempack = local_4a8.elempack;
    __return_storage_ptr__->allocator = local_4a8.allocator;
    __return_storage_ptr__->dims = local_4a8.dims;
    __return_storage_ptr__->w = local_4a8.w;
    __return_storage_ptr__->h = local_4a8.h;
    __return_storage_ptr__->d = local_4a8.d;
  }
  else {
    if (type != 0) {
      load();
      goto LAB_001636c7;
    }
    pDVar2 = this->d->dr;
    iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,&local_45c,4);
    if (CONCAT44(extraout_var,iVar3) != 4) {
      load();
      goto LAB_001636c7;
    }
    if (local_45c == 0x2c056) {
      local_438[0].data = (unsigned_short *)0x0;
      pDVar2 = this->d->dr;
      lVar1 = (long)w * 4;
      iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
      puVar7 = (unsigned_short *)local_438[0].data;
      if (CONCAT44(extraout_var_04,iVar3) == lVar1) {
        piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_4a8.allocator == (Allocator *)0x0) goto LAB_0016328b;
            (*(local_4a8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00163298;
      }
      Mat::create(&local_4a8,w,4,(Allocator *)0x0);
      if (((unsigned_short *)local_4a8.data == (unsigned_short *)0x0) ||
         ((long)local_4a8.c * local_4a8.cstep == 0)) goto LAB_00163418;
      pDVar2 = this->d->dr;
      iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4a8.data,lVar1);
      if (CONCAT44(extraout_var_08,iVar3) != lVar1) {
        load();
        goto LAB_001636c7;
      }
    }
    else {
      if (local_45c != 0xd4b38) {
        if (local_45c == 0x1306b47) {
          __new_size = (long)w * 2 + 3U & 0xfffffffffffffffc;
          local_440 = (unsigned_short *)0x0;
          pDVar2 = this->d->dr;
          iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,__new_size);
          if (CONCAT44(extraout_var_00,iVar3) == __new_size) {
            Mat::from_float16(local_438,local_440,w);
            piVar4 = (int *)CONCAT44(local_438[0].refcount._4_4_,local_438[0].refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_4a8.allocator == (Allocator *)0x0) {
                  if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
                    free(local_4a8.data);
                  }
                }
                else {
                  (*(local_4a8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar4 = (int *)CONCAT44(local_438[0].refcount._4_4_,local_438[0].refcount._0_4_);
            local_4a8.data = local_438[0].data;
            local_4a8.refcount._0_4_ = local_438[0].refcount._0_4_;
            local_4a8.refcount._4_4_ = local_438[0].refcount._4_4_;
            local_4a8.elemsize._0_4_ = (undefined4)local_438[0].elemsize;
            local_4a8.elemsize._4_4_ = local_438[0].elemsize._4_4_;
            local_4a8.elempack = local_438[0].elempack;
            local_4a8.allocator = local_438[0].allocator;
            local_4a8.dims = local_438[0].dims;
            local_4a8.w = local_438[0].w;
            local_4a8.h = local_438[0].h;
            local_4a8.d = local_438[0].d;
            local_4a8.c = local_438[0].c;
            local_4a8.cstep = local_438[0].cstep;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_438[0].allocator == (Allocator *)0x0) {
                  if ((unsigned_short *)local_438[0].data != (unsigned_short *)0x0) {
                    free(local_438[0].data);
                  }
                }
                else {
                  (*(local_438[0].allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_438[0].cstep = 0;
            local_438[0].data = (unsigned_short *)0x0;
            local_438[0].refcount._0_4_ = 0;
            local_438[0].refcount._4_4_ = 0;
            local_438[0].elemsize._0_4_ = 0;
            local_438[0].elemsize._4_4_ = 0;
            local_438[0].elempack = 0;
            local_438[0].dims = 0;
            local_438[0].w = 0;
            local_438[0].h = 0;
            local_438[0].d = 0;
            local_438[0].c = 0;
          }
          else {
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_458,
                       __new_size);
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])
                              (pDVar2,local_458.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,__new_size);
            uVar6 = CONCAT44(extraout_var_09,iVar3);
            if (uVar6 == __new_size) {
              Mat::from_float16(local_438,
                                (unsigned_short *)
                                local_458.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,w);
              piVar4 = (int *)CONCAT44(local_438[0].refcount._4_4_,local_438[0].refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_4a8.allocator == (Allocator *)0x0) {
                    if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
                      free(local_4a8.data);
                    }
                  }
                  else {
                    (*(local_4a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar4 = (int *)CONCAT44(local_438[0].refcount._4_4_,local_438[0].refcount._0_4_);
              local_4a8.data = local_438[0].data;
              local_4a8.refcount._0_4_ = local_438[0].refcount._0_4_;
              local_4a8.refcount._4_4_ = local_438[0].refcount._4_4_;
              local_4a8.elemsize._0_4_ = (undefined4)local_438[0].elemsize;
              local_4a8.elemsize._4_4_ = local_438[0].elemsize._4_4_;
              local_4a8.elempack = local_438[0].elempack;
              local_4a8.allocator = local_438[0].allocator;
              local_4a8.dims = local_438[0].dims;
              local_4a8.w = local_438[0].w;
              local_4a8.h = local_438[0].h;
              local_4a8.d = local_438[0].d;
              local_4a8.c = local_438[0].c;
              local_4a8.cstep = local_438[0].cstep;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_438[0].allocator == (Allocator *)0x0) {
                    if ((unsigned_short *)local_438[0].data != (unsigned_short *)0x0) {
                      free(local_438[0].data);
                    }
                  }
                  else {
                    (*(local_438[0].allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_438[0].cstep = 0;
              local_438[0].data = (unsigned_short *)0x0;
              local_438[0].refcount._0_4_ = 0;
              local_438[0].refcount._4_4_ = 0;
              local_438[0].elemsize._0_4_ = 0;
              local_438[0].elemsize._4_4_ = 0;
              local_438[0].elempack = 0;
              local_438[0].dims = 0;
              local_438[0].w = 0;
              local_438[0].h = 0;
              local_438[0].d = 0;
              local_438[0].c = 0;
            }
            else {
              load();
            }
LAB_00163661:
            if ((unsigned_short *)
                local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
              operator_delete(local_458.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_458.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_458.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (uVar6 != __new_size) goto LAB_001636c7;
          }
        }
        else if ((local_45c >> 0x10 & 0xff) + (local_45c >> 8 & 0xff) + (local_45c & 0xff) == 0 &&
                 local_45c >> 0x18 == 0) {
          if ((char)local_45c == '\0') {
            local_438[0].data = (unsigned_short *)0x0;
            pDVar2 = this->d->dr;
            lVar1 = (long)w * 4;
            iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
            if (CONCAT44(extraout_var_10,iVar3) == lVar1) {
              puVar7 = (unsigned_short *)local_438[0].data;
              piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_4a8.allocator == (Allocator *)0x0) {
                    if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
                      free(local_4a8.data);
                    }
                  }
                  else {
                    (*(local_4a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_4a8.refcount._0_4_ = 0;
              local_4a8.refcount._4_4_ = 0;
              local_4a8.elemsize._0_4_ = 4;
              local_4a8.elemsize._4_4_ = 0;
              local_4a8.elempack = 1;
              local_4a8.allocator = (Allocator *)0x0;
              local_4a8.dims = 1;
              local_4a8.h = 1;
              local_4a8.d = 1;
              local_4a8.c = 1;
              local_4a8.data = puVar7;
              local_4a8.w = w;
              local_4a8.cstep = (long)w;
            }
            else {
              Mat::create(&local_4a8,w,4,(Allocator *)0x0);
              if (((unsigned_short *)local_4a8.data == (unsigned_short *)0x0) ||
                 ((long)local_4a8.c * local_4a8.cstep == 0)) goto LAB_00163418;
              pDVar2 = this->d->dr;
              iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4a8.data,lVar1);
              if (CONCAT44(extraout_var_11,iVar3) != lVar1) {
                load();
                goto LAB_001636c7;
              }
            }
          }
        }
        else {
          Mat::create(&local_4a8,w,4,(Allocator *)0x0);
          if (((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) &&
             ((long)local_4a8.c * local_4a8.cstep != 0)) {
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_438,0x400);
            if (CONCAT44(extraout_var_05,iVar3) != 0x400) {
              load();
              goto LAB_001636c7;
            }
            __new_size = (long)w + 3U & 0xfffffffffffffffc;
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_458,__new_size);
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])
                              (pDVar2,local_458.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,__new_size);
            uVar6 = CONCAT44(extraout_var_06,iVar3);
            if (uVar6 == __new_size) {
              if (0 < w) {
                uVar5 = 0;
                do {
                  *(undefined4 *)((long)local_4a8.data + uVar5 * 2 * 2) =
                       *(undefined4 *)
                        ((long)&local_438[0].data +
                        (ulong)*(byte *)((long)local_458.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start + uVar5) *
                        4);
                  uVar5 = uVar5 + 1;
                } while ((uint)w != uVar5);
              }
            }
            else {
              load();
            }
            goto LAB_00163661;
          }
        }
        __return_storage_ptr__->data = local_4a8.data;
        goto LAB_00163684;
      }
      __n = (size_t)w;
      uVar6 = __n + 3 & 0xfffffffffffffffc;
      local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pDVar2 = this->d->dr;
      iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,uVar6);
      if (CONCAT44(extraout_var_03,iVar3) != uVar6) {
        local_438[0].data = (unsigned_short *)0x0;
        local_438[0].refcount._0_4_ = 0;
        local_438[0].refcount._4_4_ = 0;
        local_438[0].elemsize._0_4_ = 0;
        local_438[0].elemsize._4_4_ = 0;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_438,uVar6);
        pDVar2 = this->d->dr;
        iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_438[0].data,uVar6);
        if (CONCAT44(extraout_var_07,iVar3) == uVar6) {
          Mat::create(&local_4a8,w,1,(Allocator *)0x0);
          if (((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) &&
             ((long)local_4a8.c * local_4a8.cstep != 0)) {
            memcpy(local_4a8.data,local_438[0].data,__n);
            if ((unsigned_short *)local_438[0].data != (unsigned_short *)0x0) {
              operator_delete(local_438[0].data,
                              CONCAT44(local_438[0].elemsize._4_4_,(undefined4)local_438[0].elemsize
                                      ) - (long)local_438[0].data);
            }
            goto LAB_001632f8;
          }
          __return_storage_ptr__->data = local_4a8.data;
          piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
          __return_storage_ptr__->refcount = piVar4;
          __return_storage_ptr__->elemsize =
               CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
          __return_storage_ptr__->elempack = local_4a8.elempack;
          __return_storage_ptr__->allocator = local_4a8.allocator;
          __return_storage_ptr__->dims = local_4a8.dims;
          __return_storage_ptr__->w = local_4a8.w;
          __return_storage_ptr__->h = local_4a8.h;
          __return_storage_ptr__->d = local_4a8.d;
          __return_storage_ptr__->c = local_4a8.c;
          __return_storage_ptr__->cstep = local_4a8.cstep;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
        }
        else {
          load();
        }
        if ((unsigned_short *)local_438[0].data != (unsigned_short *)0x0) {
          operator_delete(local_438[0].data,
                          CONCAT44(local_438[0].elemsize._4_4_,(undefined4)local_438[0].elemsize) -
                          (long)local_438[0].data);
        }
        goto LAB_001636c7;
      }
      puVar7 = (unsigned_short *)
               local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_4a8.allocator == (Allocator *)0x0) {
            if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
              free(local_4a8.data);
            }
          }
          else {
            (*(local_4a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_4a8.refcount._0_4_ = 0;
      local_4a8.refcount._4_4_ = 0;
      local_4a8.elemsize._0_4_ = 1;
      local_4a8.elemsize._4_4_ = 0;
      local_4a8.elempack = 1;
      local_4a8.allocator = (Allocator *)0x0;
      local_4a8.dims = 1;
      local_4a8.h = 1;
      local_4a8.d = 1;
      local_4a8.c = 1;
      local_4a8.data = puVar7;
      local_4a8.w = w;
      local_4a8.cstep = __n;
    }
LAB_001632f8:
    __return_storage_ptr__->data = local_4a8.data;
    piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
    __return_storage_ptr__->refcount = piVar4;
    __return_storage_ptr__->elemsize =
         CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize);
    __return_storage_ptr__->elempack = local_4a8.elempack;
    __return_storage_ptr__->allocator = local_4a8.allocator;
    __return_storage_ptr__->dims = local_4a8.dims;
    __return_storage_ptr__->w = local_4a8.w;
    __return_storage_ptr__->h = local_4a8.h;
    __return_storage_ptr__->d = local_4a8.d;
  }
  __return_storage_ptr__->c = local_4a8.c;
  __return_storage_ptr__->cstep = local_4a8.cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
LAB_001636c7:
  piVar4 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_4a8.allocator == (Allocator *)0x0) {
        if ((unsigned_short *)local_4a8.data != (unsigned_short *)0x0) {
          free(local_4a8.data);
        }
      }
      else {
        (*(local_4a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(&float16_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

                m = Mat::from_float16(&float16_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(&int8_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, &int8_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(&index_array[0], align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }
        }

        return m;
    }
    else if (type == 1)
    {
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}